

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> __thiscall
cmake::CreateGlobalGenerator(cmake *this,string *gname,bool allowArch)

{
  cmExternalMakefileProjectGeneratorFactory *this_00;
  pointer pcVar1;
  pointer pbVar2;
  int iVar3;
  pointer pcVar4;
  undefined4 in_ECX;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__y;
  string *globalGenerator;
  pointer pcVar5;
  undefined8 uVar6;
  cmGlobalGenerator *this_01;
  bool bVar7;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *generator;
  string fullName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generators;
  pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extra;
  undefined1 local_d8 [32];
  _Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false> local_b8;
  undefined4 local_b0;
  uint local_ac;
  string *local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  string local_88;
  pointer local_68;
  pointer local_60;
  pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  local_b0._0_1_ = (undefined1)in_ECX;
  __y = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(in_register_00000011,allowArch);
  pcVar4 = *(pointer *)((long)&gname->field_2 + 8);
  local_68 = gname[1]._M_dataplus._M_p;
  local_a8 = gname;
  if (pcVar4 != local_68) {
    uVar6 = 0;
    local_b0 = in_ECX;
    do {
      this_00 = *(cmExternalMakefileProjectGeneratorFactory **)pcVar4;
      local_60 = pcVar4;
      cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
                (&local_a0,this_00);
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_((string *)local_d8,this_00);
      if (local_d8._8_8_ == __y->_M_string_length) {
        if (local_d8._8_8_ == 0) {
          bVar7 = true;
        }
        else {
          iVar3 = bcmp((void *)local_d8._0_8_,(__y->_M_dataplus)._M_p,local_d8._8_8_);
          bVar7 = iVar3 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if ((cmGlobalGenerator *)local_d8._0_8_ != (cmGlobalGenerator *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
      }
      pbVar2 = local_a0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_ac = (uint)uVar6;
      globalGenerator =
           local_a0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if (bVar7) {
        (*this_00->_vptr_cmExternalMakefileProjectGeneratorFactory[2])(local_d8,this_00);
        if (local_a0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_a0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        std::
        pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_true>
                  (&local_58,
                   (unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
                    *)local_d8,
                   local_a0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        if ((cmGlobalGenerator *)local_d8._0_8_ != (cmGlobalGenerator *)0x0) {
          (**(code **)(*(long *)local_d8._0_8_ + 8))();
        }
LAB_0031c23e:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a0);
        if ((local_ac & 1) == 0) goto LAB_0031c26b;
        break;
      }
      for (; globalGenerator != pbVar2; globalGenerator = globalGenerator + 1) {
        cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_88,this_00);
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                  ((string *)local_d8,globalGenerator,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if (local_d8._8_8_ == __y->_M_string_length) {
          if (local_d8._8_8_ == 0) {
            bVar7 = true;
          }
          else {
            iVar3 = bcmp((void *)local_d8._0_8_,(__y->_M_dataplus)._M_p,local_d8._8_8_);
            bVar7 = iVar3 == 0;
          }
        }
        else {
          bVar7 = false;
        }
        if (bVar7) {
          (*this_00->_vptr_cmExternalMakefileProjectGeneratorFactory[2])(&local_88,this_00);
          std::
          pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_true>
                    (&local_58,
                     (unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
                      *)&local_88,globalGenerator);
          if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
          }
          if ((cmGlobalGenerator *)local_d8._0_8_ != (cmGlobalGenerator *)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
          }
          if (bVar7) goto LAB_0031c23e;
        }
        else if ((cmGlobalGenerator *)local_d8._0_8_ != (cmGlobalGenerator *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a0);
      pcVar4 = local_60 + 8;
      uVar6 = CONCAT71((int7)((ulong)pbVar2 >> 8),pcVar4 == local_68);
    } while (pcVar4 != local_68);
  }
  local_d8._0_8_ = (cmGlobalGenerator *)0x0;
  std::
  pair<std::unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::nullptr_t,_true>(&local_58,(void **)local_d8,__y);
LAB_0031c26b:
  (this->Generators).
  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pcVar4 = (local_a8->_M_dataplus)._M_p;
  pcVar1 = (pointer)local_a8->_M_string_length;
  if (pcVar4 == pcVar1) {
    this_01 = (cmGlobalGenerator *)0x0;
  }
  else {
    do {
      pcVar5 = pcVar4 + 8;
      (**(code **)(**(long **)pcVar4 + 0x10))
                (local_d8,*(long **)pcVar4,&local_58.second,(undefined1)local_b0,local_a8);
      this_01 = (cmGlobalGenerator *)local_d8._0_8_;
      if ((cmGlobalGenerator *)local_d8._0_8_ != (cmGlobalGenerator *)0x0) break;
      pcVar4 = pcVar5;
    } while (pcVar5 != pcVar1);
  }
  (this->Generators).
  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this_01;
  if (this_01 != (cmGlobalGenerator *)0x0) {
    local_b8._M_head_impl =
         (cmExternalMakefileProjectGenerator *)
         local_58.first._M_t.
         super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
         .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl;
    local_58.first._M_t.
    super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
    .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>,_true,_true>
          )(__uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
            )0x0;
    cmGlobalGenerator::SetExternalMakefileProjectGenerator
              (this_01,(unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
                        *)&local_b8);
    if (local_b8._M_head_impl != (cmExternalMakefileProjectGenerator *)0x0) {
      (*(local_b8._M_head_impl)->_vptr_cmExternalMakefileProjectGenerator[1])();
    }
    local_b8._M_head_impl = (cmExternalMakefileProjectGenerator *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.second._M_dataplus._M_p != &local_58.second.field_2) {
    operator_delete(local_58.second._M_dataplus._M_p,
                    local_58.second.field_2._M_allocated_capacity + 1);
  }
  if ((_Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>)
      local_58.first._M_t.
      super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
      .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl !=
      (_Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_58.first._M_t.
        super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
        .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl)[1])();
  }
  return (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmGlobalGenerator> cmake::CreateGlobalGenerator(
  const std::string& gname, bool allowArch)
{
  std::pair<std::unique_ptr<cmExternalMakefileProjectGenerator>, std::string>
    extra = createExtraGenerator(this->ExtraGenerators, gname);
  std::unique_ptr<cmExternalMakefileProjectGenerator>& extraGenerator =
    extra.first;
  const std::string& name = extra.second;

  std::unique_ptr<cmGlobalGenerator> generator;
  for (const auto& g : this->Generators) {
    generator = g->CreateGlobalGenerator(name, allowArch, this);
    if (generator) {
      break;
    }
  }

  if (generator) {
    generator->SetExternalMakefileProjectGenerator(std::move(extraGenerator));
  }

  return generator;
}